

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime.c
# Opt level: O0

int week_calc(tm *timeptr,int wtype)

{
  int iVar1;
  int iVar2;
  int local_34;
  int iStack_30;
  int firstday;
  div_t weeks;
  int week;
  int bias;
  int wday;
  int wtype_local;
  tm *timeptr_local;
  
  if (wtype < 2) {
    _iStack_30 = div(timeptr->tm_yday,7);
    if (((timeptr->tm_wday + 7) - wtype) % 7 <= firstday) {
      firstday = 0;
      iStack_30 = iStack_30 + 1;
    }
    timeptr_local._4_4_ = iStack_30;
  }
  else {
    week = timeptr->tm_wday;
    if (week == 0) {
      week = 7;
    }
    weeks.quot = ((timeptr->tm_yday - week) + 0xb) / 7;
    if (weeks.quot == 0x35) {
      iVar2 = timeptr->tm_yday;
      iVar1 = _PDCLIB_is_leap(timeptr->tm_year);
      if (0x168 < (iVar2 - week) - iVar1) {
        weeks.quot = 1;
      }
    }
    else if (weeks.quot == 0) {
      local_34 = timeptr->tm_wday - timeptr->tm_yday % 7;
      if (local_34 < 0) {
        local_34 = local_34 + 7;
      }
      if ((local_34 == 5) ||
         ((iVar2 = _PDCLIB_is_leap(timeptr->tm_year + -1), iVar2 != 0 && (local_34 == 6)))) {
        weeks.quot = 0x35;
      }
      else {
        weeks.quot = 0x34;
      }
    }
    if (wtype == 2) {
      timeptr_local._4_4_ = weeks.quot;
    }
    else {
      weeks.rem = 0;
      if ((weeks.quot < 0x34) || (timeptr->tm_mon != 0)) {
        if ((weeks.quot == 1) && (timeptr->tm_mon == 0xb)) {
          weeks.rem = 1;
        }
      }
      else {
        weeks.rem = -1;
      }
      timeptr_local._4_4_ = timeptr->tm_year + 0x76c + weeks.rem;
    }
  }
  return timeptr_local._4_4_;
}

Assistant:

static int week_calc( const struct tm * timeptr, int wtype )
{
    int wday;
    int bias;
    int week;

    if ( wtype <= E_MONDAY )
    {
        /* Simple -- first week starting with E_SUNDAY / E_MONDAY,
           days before that are week 0.
        */
        div_t weeks = div( timeptr->tm_yday, 7 );
        wday = ( timeptr->tm_wday + 7 - wtype ) % 7;

        if ( weeks.rem >= wday )
        {
            ++weeks.quot;
        }

        return weeks.quot;
    }

    /* calculating ISO week; relies on Sunday == 7 */
    wday = timeptr->tm_wday;

    if ( wday == 0 )
    {
        wday = 7;
    }

    /* https://en.wikipedia.org/wiki/ISO_week_date */
    week = ( timeptr->tm_yday - wday + 11 ) / 7;

    if ( week == 53 )
    {
        /* date *may* belong to the *next* year, if:
           * it is 31.12. and Monday - Wednesday
           * it is 30.12. and Monday - Tuesday
           * it is 29.12. and Monday
           We can safely assume December...
        */
        if ( ( timeptr->tm_yday - wday - _PDCLIB_is_leap( timeptr->tm_year ) ) > 360 )
        {
            week = 1;
        }
    }
    else if ( week == 0 )
    {
        /* date *does* belong to *previous* year,
           i.e. has week 52 *unless*...
           * current year started on a Friday, or
           * previous year is leap and this year
             started on a Saturday.
        */
        int firstday = timeptr->tm_wday - ( timeptr->tm_yday % 7 );

        if ( firstday < 0 )
        {
            firstday += 7;
        }

        if ( ( firstday == 5 ) || ( _PDCLIB_is_leap( timeptr->tm_year - 1 ) && firstday == 6 ) )
        {
            week = 53;
        }
        else
        {
            week = 52;
        }
    }

    if ( wtype == E_ISO_WEEK )
    {
        return week;
    }

    /* E_ISO_YEAR -- determine the "week-based year" */
    bias = 0;

    if ( week >= 52 && timeptr->tm_mon == 0 )
    {
        --bias;
    }
    else if ( week == 1 && timeptr->tm_mon == 11 )
    {
        ++bias;
    }

    return timeptr->tm_year + 1900 + bias;
}